

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cunit.c
# Opt level: O0

void cunit_named_check(_Bool cond,char *name,int line,char *format,...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  va_list ap;
  char *format_local;
  int line_local;
  char *name_local;
  _Bool cond_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  if (cond) {
    success = success + 1;
  }
  else {
    fail = fail + 1;
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_44 = 0x30;
    local_48 = 0x20;
    local_d8 = in_R8;
    local_d0 = in_R9;
    printf("\t%s (%d) fail: ",name,(ulong)(uint)line);
    vprintf(format,&local_48);
    puts("\n");
  }
  return;
}

Assistant:

void
cunit_named_check(bool cond, const char *name, int line, const char *format, ...) {
  va_list ap;

  if (cond) {
    success++;
    return;
  }

  fail++;

  va_start(ap, format);

  printf("\t%s (%d) fail: ", name, line);
  vprintf(format, ap);
  puts("\n");
  va_end(ap);
}